

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

CFeeRate __thiscall CTxMemPool::GetMinFee(CTxMemPool *this,size_t sizelimit)

{
  long lVar1;
  int64_t iVar2;
  size_t sVar3;
  longlong lVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  if ((this->blockSinceLastRollingFeeBump == true) &&
     ((this->rollingMinimumFeeRate != 0.0 || (NAN(this->rollingMinimumFeeRate))))) {
    iVar2 = GetTime();
    if (this->lastRollingFeeUpdate + 10 < iVar2) {
      sVar3 = DynamicMemoryUsage(this);
      if (sVar3 < sizelimit >> 2) {
        dVar5 = 10800.0;
      }
      else {
        sVar3 = DynamicMemoryUsage(this);
        if (sVar3 < sizelimit >> 1) {
          dVar5 = 21600.0;
        }
        else {
          dVar5 = 43200.0;
        }
      }
      dVar6 = this->rollingMinimumFeeRate;
      dVar5 = exp2((double)(iVar2 - this->lastRollingFeeUpdate) / dVar5);
      dVar6 = dVar6 / dVar5;
      this->rollingMinimumFeeRate = dVar6;
      this->lastRollingFeeUpdate = iVar2;
      if (dVar6 < (double)(this->m_opts).incremental_relay_feerate.nSatoshisPerK * 0.5) {
        this->rollingMinimumFeeRate = 0.0;
        lVar1 = 0;
        goto LAB_00ad3fd6;
      }
    }
    lVar4 = llround(this->rollingMinimumFeeRate);
    lVar1 = (this->m_opts).incremental_relay_feerate.nSatoshisPerK;
    if (lVar1 < lVar4) {
      lVar1 = lVar4;
    }
  }
  else {
    lVar1 = llround(this->rollingMinimumFeeRate);
  }
LAB_00ad3fd6:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (CFeeRate)lVar1;
}

Assistant:

CFeeRate CTxMemPool::GetMinFee(size_t sizelimit) const {
    LOCK(cs);
    if (!blockSinceLastRollingFeeBump || rollingMinimumFeeRate == 0)
        return CFeeRate(llround(rollingMinimumFeeRate));

    int64_t time = GetTime();
    if (time > lastRollingFeeUpdate + 10) {
        double halflife = ROLLING_FEE_HALFLIFE;
        if (DynamicMemoryUsage() < sizelimit / 4)
            halflife /= 4;
        else if (DynamicMemoryUsage() < sizelimit / 2)
            halflife /= 2;

        rollingMinimumFeeRate = rollingMinimumFeeRate / pow(2.0, (time - lastRollingFeeUpdate) / halflife);
        lastRollingFeeUpdate = time;

        if (rollingMinimumFeeRate < (double)m_opts.incremental_relay_feerate.GetFeePerK() / 2) {
            rollingMinimumFeeRate = 0;
            return CFeeRate(0);
        }
    }
    return std::max(CFeeRate(llround(rollingMinimumFeeRate)), m_opts.incremental_relay_feerate);
}